

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergeFrom
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  NearestNeighborsIndex *pNVar3;
  Int64Parameter *pIVar4;
  StringVector *pSVar5;
  Int64Vector *pIVar6;
  StringVector *from_00;
  Int64Vector *from_01;
  UniformWeighting *pUVar7;
  InverseDistanceWeighting *pIVar8;
  UniformWeighting *from_02;
  InverseDistanceWeighting *from_03;
  DefaultClassLabelUnion DVar9;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NearestNeighbors.pb.cc"
               ,0x260);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) &&
     (from->nearestneighborsindex_ != (NearestNeighborsIndex *)0x0)) {
    if (this->nearestneighborsindex_ == (NearestNeighborsIndex *)0x0) {
      pNVar3 = (NearestNeighborsIndex *)operator_new(0x50);
      NearestNeighborsIndex::NearestNeighborsIndex(pNVar3);
      this->nearestneighborsindex_ = pNVar3;
    }
    pNVar3 = from->nearestneighborsindex_;
    if (pNVar3 == (NearestNeighborsIndex *)0x0) {
      pNVar3 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
    }
    NearestNeighborsIndex::MergeFrom(this->nearestneighborsindex_,pNVar3);
  }
  if ((from != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) &&
     (from->numberofneighbors_ != (Int64Parameter *)0x0)) {
    if (this->numberofneighbors_ == (Int64Parameter *)0x0) {
      pIVar4 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(pIVar4);
      this->numberofneighbors_ = pIVar4;
    }
    pIVar4 = from->numberofneighbors_;
    if (pIVar4 == (Int64Parameter *)0x0) {
      pIVar4 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this->numberofneighbors_,pIVar4);
  }
  if (from->_oneof_case_[0] == 0x65) {
    if (this->_oneof_case_[0] != 0x65) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 0x65;
      pIVar6 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(pIVar6);
      (this->ClassLabels_).int64classlabels_ = pIVar6;
    }
    pIVar6 = (this->ClassLabels_).int64classlabels_;
    if (from->_oneof_case_[0] == 0x65) {
      from_01 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_01 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(pIVar6,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    if (this->_oneof_case_[0] != 100) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      pSVar5 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(pSVar5);
      (this->ClassLabels_).stringclasslabels_ = pSVar5;
    }
    pSVar5 = (this->ClassLabels_).stringclasslabels_;
    if (from->_oneof_case_[0] == 100) {
      from_00 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(pSVar5,from_00);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x6f) {
    if (uVar1 == 0x6f) {
      DVar9 = from->DefaultClassLabel_;
    }
    else {
      DVar9.defaultint64label_ = 0;
    }
    if (this->_oneof_case_[1] != 0x6f) {
      clear_DefaultClassLabel(this);
      this->_oneof_case_[1] = 0x6f;
    }
    this->DefaultClassLabel_ = DVar9;
  }
  else if (uVar1 == 0x6e) {
    if (uVar1 != 0x6e) {
      DVar9 = (DefaultClassLabelUnion)
              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    else {
      DVar9 = from->DefaultClassLabel_;
    }
    if (this->_oneof_case_[1] != 0x6e) {
      clear_DefaultClassLabel(this);
      this->_oneof_case_[1] = 0x6e;
      this->DefaultClassLabel_ =
           (DefaultClassLabelUnion)
           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if ((string *)(this->DefaultClassLabel_).defaultint64label_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->DefaultClassLabel_).defaultstringlabel_,(string *)DVar9);
    }
    else {
      std::__cxx11::string::_M_assign((string *)(this->DefaultClassLabel_).defaultint64label_);
    }
  }
  if (from->_oneof_case_[2] == 0xd2) {
    if (this->_oneof_case_[2] != 0xd2) {
      clear_WeightingScheme(this);
      this->_oneof_case_[2] = 0xd2;
      pIVar8 = (InverseDistanceWeighting *)operator_new(0x18);
      InverseDistanceWeighting::InverseDistanceWeighting(pIVar8);
      (this->WeightingScheme_).inversedistanceweighting_ = pIVar8;
    }
    pIVar8 = (this->WeightingScheme_).inversedistanceweighting_;
    if (from->_oneof_case_[2] == 0xd2) {
      from_03 = (from->WeightingScheme_).inversedistanceweighting_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_03 = (InverseDistanceWeighting *)&_InverseDistanceWeighting_default_instance_;
    }
    InverseDistanceWeighting::MergeFrom(pIVar8,from_03);
  }
  else if (from->_oneof_case_[2] == 200) {
    if (this->_oneof_case_[2] != 200) {
      clear_WeightingScheme(this);
      this->_oneof_case_[2] = 200;
      pUVar7 = (UniformWeighting *)operator_new(0x18);
      UniformWeighting::UniformWeighting(pUVar7);
      (this->WeightingScheme_).uniformweighting_ = pUVar7;
    }
    pUVar7 = (this->WeightingScheme_).uniformweighting_;
    if (from->_oneof_case_[2] == 200) {
      from_02 = (from->WeightingScheme_).uniformweighting_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_02 = (UniformWeighting *)&_UniformWeighting_default_instance_;
    }
    UniformWeighting::MergeFrom(pUVar7,from_02);
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::MergeFrom(const KNearestNeighborsClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.KNearestNeighborsClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_nearestneighborsindex()) {
    mutable_nearestneighborsindex()->::CoreML::Specification::NearestNeighborsIndex::MergeFrom(from.nearestneighborsindex());
  }
  if (from.has_numberofneighbors()) {
    mutable_numberofneighbors()->::CoreML::Specification::Int64Parameter::MergeFrom(from.numberofneighbors());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  switch (from.DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      set_defaultstringlabel(from.defaultstringlabel());
      break;
    }
    case kDefaultInt64Label: {
      set_defaultint64label(from.defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  switch (from.WeightingScheme_case()) {
    case kUniformWeighting: {
      mutable_uniformweighting()->::CoreML::Specification::UniformWeighting::MergeFrom(from.uniformweighting());
      break;
    }
    case kInverseDistanceWeighting: {
      mutable_inversedistanceweighting()->::CoreML::Specification::InverseDistanceWeighting::MergeFrom(from.inversedistanceweighting());
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
}